

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeCommandListAppendBarrierPrologue
          (ZEeventsChecker *this,ze_command_list_handle_t hCommandList,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  allocator local_51;
  string local_50 [32];
  ze_event_handle_t *local_30;
  ze_event_handle_t *phWaitEvents_local;
  ze_event_handle_t p_Stack_20;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  ze_command_list_handle_t hCommandList_local;
  ZEeventsChecker *this_local;
  
  local_30 = phWaitEvents;
  phWaitEvents_local._4_4_ = numWaitEvents;
  p_Stack_20 = hSignalEvent;
  hSignalEvent_local = (ze_event_handle_t)hCommandList;
  hCommandList_local = (ze_command_list_handle_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"zeCommandListAppendBarrier",&local_51);
  checkForDeadlock(this,(string *)local_50,p_Stack_20,phWaitEvents_local._4_4_,local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeCommandListAppendBarrierPrologue(
    ze_command_list_handle_t hCommandList, ///< [in] handle of the command list
    ze_event_handle_t hSignalEvent,        ///< [in][optional] handle of the event to signal on completion
    uint32_t numWaitEvents,                ///< [in][optional] number of events to wait on before executing barrier;
                                           ///< must be 0 if `nullptr == phWaitEvents`
    ze_event_handle_t *phWaitEvents        ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                           ///< on before executing barrier
) {
    checkForDeadlock("zeCommandListAppendBarrier", hSignalEvent, numWaitEvents, phWaitEvents);
    return ZE_RESULT_SUCCESS;
}